

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_d2bc6b::HandleTargetMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  cmMakefile *this;
  bool bVar1;
  cmTarget *this_00;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_90 [16];
  _Alloc_hider local_80;
  size_type local_78;
  undefined1 local_70 [16];
  _Alloc_hider local_60;
  cmValue local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  p_Var2 = (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(names->_M_t)._M_impl.super__Rb_tree_header;
  bVar4 = (_Rb_tree_header *)p_Var2 == p_Var3;
  if (!bVar4) {
    local_60._M_p = (pointer)&status->Error;
    local_58.Value = propertyValue;
    do {
      bVar1 = cmMakefile::IsAlias(status->Makefile,(string *)(p_Var2 + 1));
      if (bVar1) {
        local_90._0_8_ = (element_type *)&local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"can not be used on an ALIAS target.","");
        std::__cxx11::string::_M_assign((string *)local_60._M_p);
        if ((element_type *)local_90._0_8_ == (element_type *)&local_80) {
          return bVar4;
        }
        operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_p + 1));
        return bVar4;
      }
      this_00 = cmMakefile::FindTargetToUse(status->Makefile,(string *)(p_Var2 + 1),false);
      if (this_00 == (cmTarget *)0x0) {
        local_78 = *(size_type *)(p_Var2 + 1);
        local_80._M_p = (pointer)p_Var2[1]._M_parent;
        local_90._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x16;
        local_90._8_8_ = "could not find TARGET ";
        local_70._0_8_ = 0x27;
        local_70._8_8_ = ".  Perhaps it has not yet been created.";
        views._M_len = 3;
        views._M_array = (iterator)local_90;
        cmCatViews_abi_cxx11_((string *)&local_50,views);
        std::__cxx11::string::_M_assign((string *)local_60._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_allocated_capacity != &local_40) {
          operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1)
          ;
        }
      }
      else {
        this = status->Makefile;
        if (appendMode) {
          cmMakefile::GetBacktrace(this);
          local_90._0_8_ = local_50._M_allocated_capacity;
          local_90._8_8_ = local_50._8_8_;
          local_50._M_allocated_capacity = 0;
          local_50._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_80._M_p._0_1_ = 1;
          cmTarget::AppendProperty
                    (this_00,propertyName,local_58.Value,(optional<cmListFileBacktrace> *)local_90,
                     appendAsString);
          if (((bool)local_80._M_p._0_1_ == true) &&
             (local_80._M_p = local_80._M_p & 0xffffffffffffff00,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
          }
        }
        else if (remove) {
          cmTarget::SetProperty(this_00,propertyName,(char *)0x0);
        }
        else {
          cmTarget::SetProperty(this_00,propertyName,local_58);
        }
        cmTarget::CheckProperty(this_00,propertyName,this);
      }
      if (this_00 == (cmTarget *)0x0) {
        return bVar4;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      bVar4 = (_Rb_tree_header *)p_Var2 == p_Var3;
    } while (!bVar4);
  }
  return bVar4;
}

Assistant:

bool HandleTargetMode(cmExecutionStatus& status,
                      const std::set<std::string>& names,
                      const std::string& propertyName,
                      const std::string& propertyValue, bool appendAsString,
                      bool appendMode, bool remove)
{
  for (std::string const& name : names) {
    if (status.GetMakefile().IsAlias(name)) {
      status.SetError("can not be used on an ALIAS target.");
      return false;
    }
    if (cmTarget* target = status.GetMakefile().FindTargetToUse(name)) {
      // Handle the current target.
      if (!HandleTarget(target, status.GetMakefile(), propertyName,
                        propertyValue, appendAsString, appendMode, remove)) {
        return false;
      }
    } else {
      status.SetError(cmStrCat("could not find TARGET ", name,
                               ".  Perhaps it has not yet been created."));
      return false;
    }
  }
  return true;
}